

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

uchar * nvpair_unpack_descriptor_array
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,int *fds,size_t nfds)

{
  size_t __size;
  uint uVar1;
  void *__ptr;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *p;
  
  if (nvp->nvp_type != 0xc) {
    __assert_fail("nvp->nvp_type == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x3f5,
                  "const unsigned char *nvpair_unpack_descriptor_array(_Bool, nvpair_t *, const unsigned char *, size_t *, const int *, size_t)"
                 );
  }
  __size = nvp->nvp_nitems * 8;
  if (((nvp->nvp_datasize == __size) && (nvp->nvp_nitems - 1 < __size)) && (__size <= *leftp)) {
    __ptr = malloc(__size);
    if (__ptr != (void *)0x0) {
      if (nvp->nvp_nitems != 0) {
        uVar1 = 1;
        uVar3 = 0;
        do {
          if (isbe) {
            uVar4 = *(ulong *)ptr;
            uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                    (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                    (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                    (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
          }
          else {
            uVar4 = *(ulong *)ptr;
          }
          if (((long)uVar4 < 0) || (nfds <= uVar4)) {
            piVar2 = __errno_location();
            *piVar2 = 0x16;
            free(__ptr);
            return (uchar *)0x0;
          }
          *(int *)((long)__ptr + uVar3 * 4) = fds[uVar4];
          ptr = (uchar *)((long)ptr + 8);
          *leftp = *leftp - 8;
          uVar3 = (ulong)uVar1;
          uVar1 = uVar1 + 1;
        } while (uVar3 < nvp->nvp_nitems);
      }
      nvp->nvp_data = (uint64_t)__ptr;
      return (uchar *)(ulong *)ptr;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_descriptor_array(bool isbe, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp, const int *fds, size_t nfds)
{
	int64_t idx;
	size_t size;
	unsigned int ii;
	int *array;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_DESCRIPTOR_ARRAY);

	size = sizeof(idx) * nvp->nvp_nitems;
	if (nvp->nvp_datasize != size || *leftp < size ||
	    nvp->nvp_nitems == 0 || size < nvp->nvp_nitems) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	array = (int *)nv_malloc(size);
	if (array == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		if (isbe)
			idx = be64dec(ptr);
		else
			idx = le64dec(ptr);

		if (idx < 0) {
			ERRNO_SET(EINVAL);
			nv_free(array);
			return (NULL);
		}

		if ((size_t)idx >= nfds) {
			ERRNO_SET(EINVAL);
			nv_free(array);
			return (NULL);
		}

		array[ii] = (uint64_t)fds[idx];

		ptr += sizeof(idx);
		*leftp -= sizeof(idx);
	}

	nvp->nvp_data = (uint64_t)(uintptr_t)array;

	return (ptr);
}